

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall TypedImageChannel<float>::black(TypedImageChannel<float> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Image *pIVar5;
  float *__s;
  ImageChannel *in_RDI;
  size_t ny;
  size_t nx;
  
  pIVar5 = ImageChannel::image(in_RDI);
  iVar3 = Image::width(pIVar5);
  iVar1 = *(int *)&in_RDI[1]._vptr_ImageChannel;
  pIVar5 = ImageChannel::image(in_RDI);
  iVar4 = Image::height(pIVar5);
  iVar2 = *(int *)((long)&in_RDI[1]._vptr_ImageChannel + 4);
  __s = Imf_3_4::Array2D<float>::operator[]((Array2D<float> *)&in_RDI[1]._image,0);
  memset(__s,0,((ulong)(long)iVar3 / (ulong)(long)iVar1) * ((ulong)(long)iVar4 / (ulong)(long)iVar2)
               * 4);
  return;
}

Assistant:

void
TypedImageChannel<T>::black ()
{
    size_t nx = static_cast<size_t> (image ().width ()) /
                static_cast<size_t> (_xSampling);
    size_t ny = static_cast<size_t> (image ().height ()) /
                static_cast<size_t> (_ySampling);
    memset (&_pixels[0][0], 0, nx * ny * sizeof (T));
}